

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O1

String * __thiscall
indigox::Element::ToString_abi_cxx11_(String *__return_storage_ptr__,Element *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->symbol_)._M_dataplus._M_p,(this->symbol_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

String Element::ToString() const {
    std::stringstream ss;
    ss << name_ << " (" << symbol_ << ")";
    return ss.str();
  }